

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_CERTIFY_INFO_Unmarshal(TPMS_CERTIFY_INFO *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_CERTIFY_INFO *target_local;
  
  target_local._4_4_ = TPM2B_NAME_Unmarshal(&target->name,buffer,size);
  if (target_local._4_4_ == 0) {
    target_local._4_4_ = TPM2B_NAME_Unmarshal(&target->qualifiedName,buffer,size);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_CERTIFY_INFO_Unmarshal(TPMS_CERTIFY_INFO *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM2B_NAME_Unmarshal((TPM2B_NAME *)&(target->name), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_NAME_Unmarshal((TPM2B_NAME *)&(target->qualifiedName), buffer, size);
    return result;
}